

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  size_type sVar1;
  Symbol SVar2;
  FileDescriptor *file;
  Symbol result;
  FileDescriptor *local_20;
  Symbol local_18;
  
  SVar2 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_18.field_1 = SVar2.field_1;
  local_18.type = SVar2.type;
  local_20 = Symbol::GetFile(&local_18);
  if (local_20 != this->file_) {
    sVar1 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::count(&this->dependencies_,&local_20);
    if (sVar1 == 0) goto LAB_0029f2ed;
  }
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::erase(&(this->unused_dependency_)._M_t,&local_20);
LAB_0029f2ed:
  SVar2._4_4_ = 0;
  SVar2.type = local_18.type;
  SVar2.field_1.descriptor = local_18.field_1.descriptor;
  return SVar2;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}